

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O2

void __thiscall
gms_matcher::NormalizePoints
          (gms_matcher *this,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *kp,Size *size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *npts)

{
  Size SVar1;
  pointer pPVar2;
  size_type __new_size;
  pointer pKVar3;
  size_type sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int local_28;
  int iStack_24;
  
  __new_size = ((long)(kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x1c;
  SVar1 = *size;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::resize(npts,__new_size);
  pKVar3 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (npts->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_28 = SVar1.width;
  iStack_24 = SVar1.height;
  for (sVar4 = 0; __new_size != sVar4; sVar4 = sVar4 + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)pKVar3;
    auVar6._4_4_ = (float)iStack_24;
    auVar6._0_4_ = (float)local_28;
    auVar6._8_8_ = 0;
    auVar6 = divps(auVar5,auVar6);
    pPVar2[sVar4] = auVar6._0_8_;
    pKVar3 = pKVar3 + 0x1c;
  }
  return;
}

Assistant:

void NormalizePoints(const vector<KeyPoint> &kp, const Size &size, vector<Point2f> &npts) {
		const size_t numP = kp.size();
		const int width   = size.width;
		const int height  = size.height;
		npts.resize(numP);

		for (size_t i = 0; i < numP; i++)
		{
			npts[i].x = kp[i].pt.x / width;
			npts[i].y = kp[i].pt.y / height;
		}
	}